

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint32_t uVar1;
  uint local_24;
  uint i;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  pmu_op_start_aarch64(env);
  if ((value & 4) != 0) {
    (env->cp15).c15_ccnt = 0;
  }
  if ((value & 2) != 0) {
    for (local_24 = 0; uVar1 = pmu_num_counters(env), local_24 < uVar1; local_24 = local_24 + 1) {
      (env->cp15).c14_pmevcntr[local_24] = 0;
    }
  }
  (env->cp15).c9_pmcr = (env->cp15).c9_pmcr & 0xffffffffffffff86;
  (env->cp15).c9_pmcr = value & 0x79 | (env->cp15).c9_pmcr;
  pmu_op_finish_aarch64(env);
  return;
}

Assistant:

static void pmcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                       uint64_t value)
{
    pmu_op_start(env);

    if (value & PMCRC) {
        /* The counter has been reset */
        env->cp15.c15_ccnt = 0;
    }

    if (value & PMCRP) {
        unsigned int i;
        for (i = 0; i < pmu_num_counters(env); i++) {
            env->cp15.c14_pmevcntr[i] = 0;
        }
    }

    env->cp15.c9_pmcr &= ~PMCR_WRITEABLE_MASK;
    env->cp15.c9_pmcr |= (value & PMCR_WRITEABLE_MASK);

    pmu_op_finish(env);
}